

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QWidgetItemData>>(QDataStream *s,QList<QWidgetItemData> *c)

{
  QDataStream QVar1;
  anon_union_24_3_e3d07ef4_for_data *this;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  uint local_64;
  QWidgetItemData local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QWidgetItemData>::clear(c);
  local_64 = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_64);
  asize = (undefined1 *)(ulong)local_64;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_60);
      asize = (undefined1 *)local_60._0_8_;
      if ((long)local_60._0_8_ < 0) goto LAB_0058181b;
    }
  }
  else if (local_64 == 0xffffffff) {
LAB_0058181b:
    QDataStream::setStatus((Status)s);
    goto LAB_005818f9;
  }
  QList<QWidgetItemData>::reserve(c,(qsizetype)asize);
  if (asize != (undefined1 *)0x0) {
    this = (anon_union_24_3_e3d07ef4_for_data *)&local_60.value;
    do {
      local_60._0_8_ = (undefined1 *)0xaaaaaaaaffffffff;
      local_60.value.d.data.shared = (PrivateShared *)0x0;
      local_60.value.d.data._8_8_ = 0;
      local_60.value.d.data._16_8_ = 0;
      local_60.value.d._24_8_ = 2;
      QDataStream::operator>>(s,&local_60.role);
      ::operator>>(s,(QVariant *)this);
      if (s[0x13] != (QDataStream)0x0) {
        QList<QWidgetItemData>::clear(c);
        ::QVariant::~QVariant((QVariant *)this);
        break;
      }
      QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData_const&>
                ((QMovableArrayOps<QWidgetItemData> *)c,(c->d).size,&local_60);
      QList<QWidgetItemData>::end(c);
      ::QVariant::~QVariant((QVariant *)this);
      asize = asize + -1;
    } while (asize != (undefined1 *)0x0);
  }
LAB_005818f9:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}